

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_extension.cc
# Opt level: O0

void anon_unknown.dwarf_3ee78::PrintHeader(MallocExtensionWriter *writer,char *label,void **entries)

{
  uintptr_t uVar1;
  char *kTitle;
  void **entry;
  uintptr_t total_size;
  uintptr_t total_count;
  void **entries_local;
  char *label_local;
  MallocExtensionWriter *writer_local;
  
  total_size = 0;
  entry = (void **)0x0;
  kTitle = (char *)entries;
  while( true ) {
    uVar1 = Count((void **)kTitle);
    if (uVar1 == 0) break;
    uVar1 = Count((void **)kTitle);
    total_size = uVar1 + total_size;
    uVar1 = Size((void **)kTitle);
    entry = (void **)(uVar1 + (long)entry);
    uVar1 = Depth((void **)kTitle);
    kTitle = kTitle + (uVar1 + 3) * 8;
  }
  std::__cxx11::string::append((char *)writer,0x13ccf1);
  PrintCountAndSize(writer,total_size,(uintptr_t)entry);
  std::__cxx11::string::append((char *)writer,0x13be4f);
  strlen(label);
  std::__cxx11::string::append((char *)writer,(ulong)label);
  std::__cxx11::string::append((char *)writer,0x13b4ab);
  return;
}

Assistant:

void PrintHeader(MallocExtensionWriter* writer,
                 const char* label, void** entries) {
  // Compute the total count and total size
  uintptr_t total_count = 0;
  uintptr_t total_size = 0;
  for (void** entry = entries; Count(entry) != 0; entry += 3 + Depth(entry)) {
    total_count += Count(entry);
    total_size += Size(entry);
  }

  const char* const kTitle = "heap profile: ";
  writer->append(kTitle, strlen(kTitle));
  PrintCountAndSize(writer, total_count, total_size);
  writer->append(" ", 1);
  writer->append(label, strlen(label));
  writer->append("\n", 1);
}